

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_int,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_int,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  ulong uVar3;
  uint uVar4;
  uint *__dest;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  FP32 f;
  float fVar10;
  uint16_t outValue;
  ushort local_48;
  allocator_type local_45;
  uint local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ulong local_38;
  
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned int, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned int, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned int, 4>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned int, componentCount = 4]"
                 );
  }
  uVar8 = targetBits >> 3;
  local_40 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar8 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_45);
  pvVar2 = local_40;
  if ((this->super_Image).height != 0) {
    local_38 = (ulong)uVar8;
    uVar5 = 0;
    local_44 = uVar8;
    do {
      if ((this->super_Image).width != 0) {
        uVar9 = 0;
        do {
          if (numChannels != 0) {
            uVar7 = 0;
            do {
              uVar4 = (this->super_Image).width * uVar5 + uVar9;
              uVar6 = (uint)uVar7;
              uVar3 = 3;
              if (uVar6 < 3) {
                uVar3 = uVar7;
              }
              uVar1 = this->pixels[uVar4].field_0.comps[uVar3];
              __dest = (uint *)((pvVar2->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_start +
                               (uVar4 * numChannels + uVar6) * uVar8);
              if (targetBits == 0x10) {
                fVar10 = (float)uVar1;
                uVar8 = (uint)fVar10 >> 0x17;
                if (uVar8 == 0) {
                  local_48 = 0;
                }
                else if (uVar8 == 0xff) {
                  local_48 = (((uint)fVar10 & 0x7fffff) != 0 | 0x3e) << 9;
                }
                else {
                  local_48 = 0x7c00;
                  if ((uint)fVar10 < 0x47800000) {
                    if ((uint)fVar10 < 0x38800000) {
                      if ((uint)fVar10 < 0x33000000) {
                        local_48 = 0;
                        goto LAB_0017a149;
                      }
                      uVar4 = (uint)fVar10 & 0x7fffff | 0x800000;
                      local_48 = (ushort)(uVar4 >> (0x7eU - (char)uVar8 & 0x1f)) & 0x3ff;
                      uVar4 = uVar4 >> ((byte)(0x7d - (char)uVar8) & 0x1f);
                    }
                    else {
                      local_48 = ((ushort)((uint)fVar10 >> 0xd) & 0x3ff |
                                 (ushort)((uVar8 & 0x1f) << 10)) ^ 0x4000;
                      uVar4 = (uint)fVar10 >> 0xc;
                    }
                    local_48 = local_48 + ((uVar4 & 1) != 0);
                  }
LAB_0017a149:
                  local_48 = local_48 & 0x7fff;
                }
                memcpy(__dest,&local_48,local_38);
                pvVar2 = local_40;
                uVar8 = local_44;
              }
              else if (targetBits == 0x20) {
                *__dest = uVar1;
              }
              uVar7 = (ulong)(uVar6 + 1);
            } while (numChannels != uVar6 + 1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (this->super_Image).width);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Image).height);
  }
  return pvVar2;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }